

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

Graph * __thiscall Graph::add(Graph *this,double d)

{
  Matrix local_118;
  double local_18;
  double d_local;
  Graph *this_local;
  
  local_18 = d;
  d_local = (double)this;
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_118,&this->super_Matrix,1);
  Matrix::add(&local_118,local_18);
  Matrix::~Matrix(&local_118);
  Matrix::transpose(&this->super_Matrix);
  return this;
}

Assistant:

Graph& add( double d ) {
		transpose();
		operator[](1).add(d);
		transpose();
		return *this;
	}